

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int neverbleed_setuidgid(neverbleed_t *nb,char *user,int change_socket_ownership)

{
  int iVar1;
  st_neverbleed_thread_data_t *psVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  expbuf_t buf;
  expbuf_t local_58;
  
  psVar2 = get_thread_data(nb);
  local_58.end = (char *)0x0;
  local_58.capacity = 0;
  local_58.buf = (char *)0x0;
  local_58.start = (char *)0x0;
  expbuf_reserve(&local_58,10);
  builtin_strncpy(local_58.end,"setuidgid",10);
  local_58.end = local_58.end + 10;
  sVar3 = strlen(user);
  expbuf_reserve(&local_58,sVar3 + 1);
  pcVar5 = local_58.end;
  memcpy(local_58.end,user,sVar3 + 1);
  local_58.end = pcVar5 + sVar3 + 1;
  expbuf_reserve(&local_58,8);
  *(long *)local_58.end = (long)change_socket_ownership;
  local_58.end = (char *)((long)local_58.end + 8);
  iVar1 = expbuf_write((expbuf_t *)local_58.start,(int)local_58.end);
  if (iVar1 == 0) {
    expbuf_dispose(&local_58);
    iVar1 = expbuf_read(&local_58,psVar2->fd);
    if (iVar1 == 0) {
      if (7 < (ulong)((long)local_58.end - (long)local_58.start)) {
        iVar1 = *(int *)(char **)local_58.start;
        local_58.start = (char *)((long)local_58.start + 8);
        expbuf_dispose(&local_58);
        return iVar1;
      }
      piVar4 = __errno_location();
      *piVar4 = 0;
      pcVar5 = "failed to parse response";
      goto LAB_00188ad6;
    }
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    pcVar5 = "read error";
  }
  else {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    pcVar5 = "write error";
  }
  if (iVar1 == 0) {
    pcVar5 = "connection closed by daemon";
  }
LAB_00188ad6:
  dief(pcVar5);
}

Assistant:

int neverbleed_setuidgid(neverbleed_t *nb, const char *user, int change_socket_ownership)
{
    struct st_neverbleed_thread_data_t *thdata = get_thread_data(nb);
    struct expbuf_t buf = {NULL};
    size_t ret;

    expbuf_push_str(&buf, "setuidgid");
    expbuf_push_str(&buf, user);
    expbuf_push_num(&buf, change_socket_ownership);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0) {
        errno = 0;
        dief("failed to parse response");
    }
    expbuf_dispose(&buf);

    return (int)ret;
}